

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCSat.c
# Opt level: O1

int Cbs_ManAnalyze(Cbs_Man_t *p,int Level,Gia_Obj_t *pVar,Gia_Obj_t *pFan0,Gia_Obj_t *pFan1)

{
  int iVar1;
  int iVar2;
  Gia_Obj_t **ppGVar3;
  int iVar4;
  
  if ((pVar->field_0x3 & 0x40) == 0) {
    __assert_fail("Cbs_VarIsAssigned(pVar)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSat.c"
                  ,0x29b,
                  "int Cbs_ManAnalyze(Cbs_Man_t *, int, Gia_Obj_t *, Gia_Obj_t *, Gia_Obj_t *)");
  }
  if ((pFan0->field_0x3 & 0x40) == 0) {
    __assert_fail("Cbs_VarIsAssigned(pFan0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSat.c"
                  ,0x29c,
                  "int Cbs_ManAnalyze(Cbs_Man_t *, int, Gia_Obj_t *, Gia_Obj_t *, Gia_Obj_t *)");
  }
  if ((pFan1 != (Gia_Obj_t *)0x0) && ((pFan1->field_0x3 & 0x40) == 0)) {
    __assert_fail("pFan1 == NULL || Cbs_VarIsAssigned(pFan1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSat.c"
                  ,0x29d,
                  "int Cbs_ManAnalyze(Cbs_Man_t *, int, Gia_Obj_t *, Gia_Obj_t *, Gia_Obj_t *)");
  }
  iVar1 = (p->pClauses).iTail;
  if ((p->pClauses).iHead != iVar1) {
    __assert_fail("Cbs_QueIsEmpty( pQue )",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSat.c"
                  ,0x29e,
                  "int Cbs_ManAnalyze(Cbs_Man_t *, int, Gia_Obj_t *, Gia_Obj_t *, Gia_Obj_t *)");
  }
  iVar2 = (p->pClauses).nSize;
  if (iVar1 == iVar2) {
    (p->pClauses).nSize = iVar2 * 2;
    ppGVar3 = (p->pClauses).pData;
    if (ppGVar3 == (Gia_Obj_t **)0x0) {
      ppGVar3 = (Gia_Obj_t **)malloc((long)iVar2 << 4);
    }
    else {
      ppGVar3 = (Gia_Obj_t **)realloc(ppGVar3,(long)iVar2 << 4);
    }
    (p->pClauses).pData = ppGVar3;
  }
  iVar1 = (p->pClauses).iTail;
  iVar2 = iVar1 + 1;
  (p->pClauses).iTail = iVar2;
  (p->pClauses).pData[iVar1] = (Gia_Obj_t *)0x0;
  if (((ulong)pVar & 1) == 0) {
    iVar1 = (p->pClauses).nSize;
    if (iVar2 == iVar1) {
      (p->pClauses).nSize = iVar1 * 2;
      ppGVar3 = (p->pClauses).pData;
      if (ppGVar3 == (Gia_Obj_t **)0x0) {
        ppGVar3 = (Gia_Obj_t **)malloc((long)iVar1 << 4);
      }
      else {
        ppGVar3 = (Gia_Obj_t **)realloc(ppGVar3,(long)iVar1 << 4);
      }
      (p->pClauses).pData = ppGVar3;
    }
    iVar1 = (p->pClauses).iTail;
    iVar2 = iVar1 + 1;
    (p->pClauses).iTail = iVar2;
    (p->pClauses).pData[iVar1] = pVar;
    if (((ulong)pFan0 & 1) == 0) {
      iVar1 = (p->pClauses).nSize;
      if (iVar2 == iVar1) {
        (p->pClauses).nSize = iVar1 * 2;
        ppGVar3 = (p->pClauses).pData;
        if (ppGVar3 == (Gia_Obj_t **)0x0) {
          ppGVar3 = (Gia_Obj_t **)malloc((long)iVar1 << 4);
        }
        else {
          ppGVar3 = (Gia_Obj_t **)realloc(ppGVar3,(long)iVar1 << 4);
        }
        (p->pClauses).pData = ppGVar3;
      }
      iVar1 = (p->pClauses).iTail;
      iVar2 = iVar1 + 1;
      (p->pClauses).iTail = iVar2;
      (p->pClauses).pData[iVar1] = pFan0;
      if (pFan1 != (Gia_Obj_t *)0x0) {
        if (((ulong)pFan1 & 1) != 0) goto LAB_0071480f;
        iVar1 = (p->pClauses).nSize;
        if (iVar2 == iVar1) {
          (p->pClauses).nSize = iVar1 * 2;
          ppGVar3 = (p->pClauses).pData;
          if (ppGVar3 == (Gia_Obj_t **)0x0) {
            ppGVar3 = (Gia_Obj_t **)malloc((long)iVar1 << 4);
          }
          else {
            ppGVar3 = (Gia_Obj_t **)realloc(ppGVar3,(long)iVar1 << 4);
          }
          (p->pClauses).pData = ppGVar3;
        }
        iVar1 = (p->pClauses).iTail;
        (p->pClauses).iTail = iVar1 + 1;
        (p->pClauses).pData[iVar1] = pFan1;
      }
      Cbs_ManDeriveReason(p,Level);
      iVar1 = (p->pClauses).iHead;
      iVar2 = (p->pClauses).iTail;
      if (iVar1 < iVar2) {
        iVar4 = (p->pClauses).nSize;
        if (iVar2 == iVar4) {
          (p->pClauses).nSize = iVar4 * 2;
          ppGVar3 = (p->pClauses).pData;
          if (ppGVar3 == (Gia_Obj_t **)0x0) {
            ppGVar3 = (Gia_Obj_t **)malloc((long)iVar4 << 4);
          }
          else {
            ppGVar3 = (Gia_Obj_t **)realloc(ppGVar3,(long)iVar4 << 4);
          }
          (p->pClauses).pData = ppGVar3;
        }
        iVar2 = (p->pClauses).iTail;
        iVar4 = iVar2 + 1;
        (p->pClauses).iTail = iVar4;
        (p->pClauses).pData[iVar2] = (Gia_Obj_t *)0x0;
        (p->pClauses).iHead = iVar4;
        return iVar1;
      }
      __assert_fail("p->iHead < p->iTail",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSat.c"
                    ,0x172,"int Cbs_QueFinish(Cbs_Que_t *)");
    }
  }
LAB_0071480f:
  __assert_fail("!Gia_IsComplement(pObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSat.c"
                ,0x120,"void Cbs_QuePush(Cbs_Que_t *, Gia_Obj_t *)");
}

Assistant:

static inline int Cbs_ManAnalyze( Cbs_Man_t * p, int Level, Gia_Obj_t * pVar, Gia_Obj_t * pFan0, Gia_Obj_t * pFan1 )
{
    Cbs_Que_t * pQue = &(p->pClauses);
    assert( Cbs_VarIsAssigned(pVar) );
    assert( Cbs_VarIsAssigned(pFan0) );
    assert( pFan1 == NULL || Cbs_VarIsAssigned(pFan1) );
    assert( Cbs_QueIsEmpty( pQue ) );
    Cbs_QuePush( pQue, NULL );
    Cbs_QuePush( pQue, pVar );
    Cbs_QuePush( pQue, pFan0 );
    if ( pFan1 )
        Cbs_QuePush( pQue, pFan1 );
    Cbs_ManDeriveReason( p, Level );
    return Cbs_QueFinish( pQue );
}